

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerResults.cpp
# Opt level: O0

SWDAnalyzerResults * __thiscall
SWDAnalyzerResults::GetSampleTimeStr_abi_cxx11_(SWDAnalyzerResults *this,S64 sample)

{
  uint uVar1;
  ulonglong uVar2;
  size_t sVar3;
  ulonglong in_RDX;
  allocator local_ad;
  int local_ac;
  char local_a8 [4];
  int l;
  char time_str [128];
  S64 sample_local;
  SWDAnalyzerResults *this_local;
  
  uVar2 = Analyzer::GetTriggerSample();
  uVar1 = Analyzer::GetSampleRate();
  AnalyzerHelpers::GetTimeString(in_RDX,uVar2,uVar1,local_a8,0x80);
  sVar3 = strlen(local_a8);
  local_ac = (int)sVar3;
  if (7 < local_ac) {
    local_a8[local_ac + -7] = '\0';
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_a8,&local_ad);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad);
  return this;
}

Assistant:

std::string SWDAnalyzerResults::GetSampleTimeStr( S64 sample ) const
{
    char time_str[ 128 ];
    AnalyzerHelpers::GetTimeString( sample, mAnalyzer->GetTriggerSample(), mAnalyzer->GetSampleRate(), time_str, sizeof( time_str ) );

    // remove trailing zeros
    int l = strlen( time_str );
    if( l > 7 )
        time_str[ l - 7 ] = '\0';

    return time_str;
}